

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makePreview.cpp
# Opt level: O1

void makePreview(char *inFileName,char *outFileName,int previewWidth,float exposure,bool verbose)

{
  long lVar1;
  int iVar2;
  double dVar3;
  char *__s;
  char *__s_00;
  uchar extraout_AL;
  uchar extraout_AL_00;
  uchar extraout_AL_01;
  char cVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  void *pvVar9;
  PreviewRgba *pPVar10;
  Header *pHVar11;
  size_t sVar12;
  undefined7 in_register_00000009;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  uchar *puVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  TiledOutputFile out;
  InputFile in;
  Header header;
  ulong local_110;
  int local_108;
  int local_c0;
  PreviewImage local_b0 [32];
  InputFile local_90 [16];
  char *local_80;
  char *local_78;
  Rgba local_70 [8];
  undefined1 extraout_var [12];
  
  local_78 = outFileName;
  if ((int)CONCAT71(in_register_00000009,verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"generating preview image",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  iVar5 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_70,inFileName,iVar5);
  local_80 = inFileName;
  piVar6 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
  lVar18 = (long)*piVar6;
  iVar5 = piVar6[1];
  uVar16 = piVar6[2];
  iVar2 = piVar6[3];
  fVar19 = (float)Imf_3_2::RgbaInputFile::pixelAspectRatio();
  lVar7 = (int)uVar16 - lVar18;
  lVar1 = lVar7 + 1;
  iVar15 = (iVar2 - iVar5) + 1;
  uVar8 = iVar15 * lVar1;
  pvVar9 = operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 * 8);
  Imf_3_2::RgbaInputFile::setFrameBuffer
            (local_70,(long)pvVar9 + ((int)~uVar16 + lVar18) * (long)iVar5 * 8 + lVar18 * -8,1);
  Imf_3_2::RgbaInputFile::readPixels((int)local_70,iVar5);
  local_c0 = (int)lVar1;
  uVar16 = (uint)((float)previewWidth * ((float)iVar15 / (fVar19 * (float)local_c0)) + 0.5);
  uVar8 = 1;
  if (1 < (int)uVar16) {
    uVar8 = (ulong)uVar16;
  }
  uVar13 = uVar8 * (long)previewWidth;
  uVar14 = uVar13 * 4;
  pPVar10 = (PreviewRgba *)operator_new__(-(ulong)(uVar13 >> 0x3e != 0) | uVar14);
  if (previewWidth != 0) {
    uVar13 = 0;
    do {
      *(undefined4 *)(&pPVar10->r + uVar13) = 0xff000000;
      uVar13 = uVar13 + 4;
    } while (uVar14 != uVar13);
  }
  dVar23 = 1.0;
  if (previewWidth < 2) {
    dVar3 = 1.0;
  }
  else {
    local_108 = (int)lVar7;
    dVar3 = (double)local_108 / (double)(previewWidth + -1);
  }
  if (1 < (int)uVar16) {
    dVar23 = (double)(iVar2 - iVar5) / (double)(int)((uint)uVar8 - 1);
  }
  fVar20 = exposure + 2.47393;
  fVar19 = 20.0;
  if (fVar20 <= 20.0) {
    fVar19 = fVar20;
  }
  auVar21._0_4_ =
       exp2f((float)(-(uint)(fVar20 < -20.0) & 0xc1a00000 | ~-(uint)(fVar20 < -20.0) & (uint)fVar19)
            );
  auVar21._4_12_ = extraout_var;
  puVar17 = &pPVar10->a;
  local_110 = 0;
  auVar22 = auVar21;
  do {
    if (0 < previewWidth) {
      lVar7 = (int)((double)(int)local_110 * dVar23 + 0.5) * lVar1;
      uVar13 = 0;
      do {
        lVar18 = (long)(int)((double)(int)uVar13 * dVar3 + 0.5);
        anon_unknown.dwarf_4c01::gamma
                  ((anon_unknown_dwarf_4c01 *)
                   (ulong)*(ushort *)((long)pvVar9 + lVar18 * 8 + lVar7 * 8),auVar22._0_8_);
        puVar17[uVar13 * 4 + -3] = extraout_AL;
        anon_unknown.dwarf_4c01::gamma
                  ((anon_unknown_dwarf_4c01 *)
                   (ulong)*(ushort *)((long)pvVar9 + lVar18 * 8 + lVar7 * 8 + 2),
                   (double)(ulong)(uint)auVar21._0_4_);
        puVar17[uVar13 * 4 + -2] = extraout_AL_00;
        anon_unknown.dwarf_4c01::gamma
                  ((anon_unknown_dwarf_4c01 *)
                   (ulong)*(ushort *)((long)pvVar9 + lVar18 * 8 + lVar7 * 8 + 4),
                   (double)(ulong)(uint)auVar21._0_4_);
        puVar17[uVar13 * 4 + -1] = extraout_AL_01;
        fVar20 = *(float *)(_imath_half_to_float_table +
                           (ulong)*(ushort *)((long)pvVar9 + lVar18 * 8 + lVar7 * 8 + 6) * 4) *
                 255.0;
        fVar19 = 255.0;
        if (fVar20 <= 255.0) {
          fVar19 = fVar20;
        }
        auVar22 = ZEXT416((uint)auVar21._0_4_);
        puVar17[uVar13 * 4] =
             (uchar)(int)(float)(-(uint)(fVar20 < 0.0) & 0x3f000000 |
                                ~-(uint)(fVar20 < 0.0) & (uint)(fVar19 + 0.5));
        uVar13 = uVar13 + 1;
      } while ((uint)previewWidth != uVar13);
    }
    local_110 = local_110 + 1;
    puVar17 = puVar17 + (long)previewWidth * 4;
  } while (local_110 != uVar8);
  operator_delete__(pvVar9);
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_70);
  iVar5 = Imf_3_2::globalThreadCount();
  __s = local_80;
  Imf_3_2::InputFile::InputFile(local_90,local_80,iVar5);
  pHVar11 = (Header *)Imf_3_2::InputFile::header();
  __s_00 = local_78;
  Imf_3_2::Header::Header((Header *)local_70,pHVar11);
  Imf_3_2::PreviewImage::PreviewImage(local_b0,previewWidth,(uint)uVar8,pPVar10);
  Imf_3_2::Header::setPreviewImage((PreviewImage *)local_70);
  Imf_3_2::PreviewImage::~PreviewImage(local_b0);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"copying ",8);
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e0);
    }
    else {
      sVar12 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," to ",4);
    if (__s_00 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e0);
    }
    else {
      sVar12 = strlen(__s_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s_00,sVar12);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  cVar4 = Imf_3_2::Header::hasTileDescription();
  if (cVar4 == '\0') {
    iVar5 = Imf_3_2::globalThreadCount();
    Imf_3_2::OutputFile::OutputFile((OutputFile *)local_b0,__s_00,(Header *)local_70,iVar5);
    Imf_3_2::OutputFile::copyPixels((InputFile *)local_b0);
    Imf_3_2::OutputFile::~OutputFile((OutputFile *)local_b0);
  }
  else {
    iVar5 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledOutputFile::TiledOutputFile
              ((TiledOutputFile *)local_b0,__s_00,(Header *)local_70,iVar5);
    Imf_3_2::TiledOutputFile::copyPixels((InputFile *)local_b0);
    Imf_3_2::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)local_b0);
  }
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  Imf_3_2::Header::~Header((Header *)local_70);
  Imf_3_2::InputFile::~InputFile(local_90);
  operator_delete__(pPVar10);
  return;
}

Assistant:

void
makePreview (
    const char inFileName[],
    const char outFileName[],
    int        previewWidth,
    float      exposure,
    bool       verbose)
{
    if (verbose) cout << "generating preview image" << endl;

    Array2D<PreviewRgba> previewPixels;
    int                  previewHeight;

    generatePreview (
        inFileName, exposure, previewWidth, previewHeight, previewPixels);

    InputFile in (inFileName);
    Header    header = in.header ();

    header.setPreviewImage (
        PreviewImage (previewWidth, previewHeight, &previewPixels[0][0]));

    if (verbose)
        cout << "copying " << inFileName << " to " << outFileName << endl;

    if (header.hasTileDescription ())
    {
        TiledOutputFile out (outFileName, header);
        out.copyPixels (in);
    }
    else
    {
        OutputFile out (outFileName, header);
        out.copyPixels (in);
    }

    if (verbose) cout << "done." << endl;
}